

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *makefile,
          string *tgt)

{
  ulong uVar1;
  string *psVar2;
  string local_c8;
  string local_a8;
  undefined1 local_88 [8];
  string tgt2;
  cmGlobalUnixMakefileGenerator3 *gg;
  undefined1 local_29;
  string *local_28;
  string *tgt_local;
  string *makefile_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *cmd;
  
  local_29 = 0;
  local_28 = tgt;
  tgt_local = makefile;
  makefile_local = (string *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$(MAKE) -f ");
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&gg,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             tgt_local,SHELL);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  tgt2.field_2._8_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(tgt2.field_2._8_8_ + 0x10));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  if ((*(byte *)(tgt2.field_2._8_8_ + 0x629) & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-$(MAKEFLAGS) ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)local_88,(cmLocalGenerator *)this,psVar2,local_28);
    cmSystemTools::ConvertToOutputSlashes((string *)local_88);
    if ((this->MakeCommandEscapeTargetTwice & 1U) != 0) {
      cmOutputConverter::EscapeForShell
                (&local_a8,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_88,true,false,false);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    cmOutputConverter::EscapeForShell
              (&local_c8,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)local_88,true,false,false);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const std::string& makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd;
  cmd += "$(MAKE) -f ";
  cmd += this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL);
  cmd += " ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 =
      this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}